

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTtfGlyph>::emplace<QTtfGlyph_const&>
          (QMovableArrayOps<QTtfGlyph> *this,qsizetype i,QTtfGlyph *args)

{
  QTtfGlyph **ppQVar1;
  qsizetype *pqVar2;
  quint16 qVar3;
  long lVar4;
  Data *pDVar5;
  long lVar6;
  Data *pDVar7;
  char *pcVar8;
  qsizetype qVar9;
  QTtfGlyph *pQVar10;
  QTtfGlyph *pQVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  qint16 qVar14;
  qint16 qVar15;
  qint16 qVar16;
  qint16 qVar17;
  qint16 qVar18;
  quint16 qVar19;
  long in_FS_OFFSET;
  bool bVar20;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004b9e9e:
    qVar3 = args->numPoints;
    uVar12._0_2_ = args->index;
    uVar12._2_2_ = args->xMin;
    uVar12._4_2_ = args->xMax;
    uVar12._6_2_ = args->yMin;
    uVar13._0_2_ = args->yMax;
    uVar13._2_2_ = args->advanceWidth;
    uVar13._4_2_ = args->lsb;
    uVar13._6_2_ = args->numContours;
    pDVar7 = (args->data).d.d;
    pcVar8 = (args->data).d.ptr;
    qVar9 = (args->data).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar20 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size != 0;
    QArrayDataPointer<QTtfGlyph>::detachAndGrow
              ((QArrayDataPointer<QTtfGlyph> *)this,(uint)(i == 0 && bVar20),1,(QTtfGlyph **)0x0,
               (QArrayDataPointer<QTtfGlyph> *)0x0);
    pQVar10 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
    local_58 = (undefined4)uVar12;
    uStack_50 = (undefined4)uVar13;
    if (i != 0 || !bVar20) {
      pQVar11 = pQVar10 + i;
      memmove(pQVar11 + 1,pQVar10 + i,
              ((this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size - i
              ) * 0x30);
      pQVar11->index = (undefined2)local_58;
      pQVar11->xMin = local_58._2_2_;
      pQVar11->xMax = uVar12._4_2_;
      pQVar11->yMin = uVar12._6_2_;
      pQVar11->yMax = (undefined2)uStack_50;
      pQVar11->advanceWidth = uStack_50._2_2_;
      pQVar11->lsb = uVar13._4_2_;
      pQVar11->numContours = uVar13._6_2_;
      pQVar11->numPoints = qVar3;
      (pQVar11->data).d.d = pDVar7;
      (pQVar11->data).d.ptr = pcVar8;
      (pQVar11->data).d.size = qVar9;
      goto LAB_004b9f75;
    }
    pQVar10[-1].numPoints = qVar3;
    pQVar10[-1].index = (undefined2)local_58;
    pQVar10[-1].xMin = local_58._2_2_;
    pQVar10[-1].xMax = uVar12._4_2_;
    pQVar10[-1].yMin = uVar12._6_2_;
    pQVar10[-1].yMax = (undefined2)uStack_50;
    pQVar10[-1].advanceWidth = uStack_50._2_2_;
    pQVar10[-1].lsb = uVar13._4_2_;
    pQVar10[-1].numContours = uVar13._6_2_;
    pQVar10[-1].data.d.d = pDVar7;
    pQVar10[-1].data.d.ptr = pcVar8;
    pQVar10[-1].data.d.size = qVar9;
  }
  else {
    lVar6 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc - lVar6 !=
        ((long)((long)(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.
                      ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pQVar11 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
      pQVar11[lVar6].numPoints = args->numPoints;
      qVar14 = args->xMin;
      qVar15 = args->xMax;
      qVar16 = args->yMin;
      qVar17 = args->yMax;
      qVar3 = args->advanceWidth;
      qVar18 = args->lsb;
      qVar19 = args->numContours;
      pQVar10 = pQVar11 + lVar6;
      pQVar10->index = args->index;
      pQVar10->xMin = qVar14;
      pQVar10->xMax = qVar15;
      pQVar10->yMin = qVar16;
      pQVar10->yMax = qVar17;
      pQVar10->advanceWidth = qVar3;
      pQVar10->lsb = qVar18;
      pQVar10->numContours = qVar19;
      pDVar7 = (args->data).d.d;
      pQVar11[lVar6].data.d.d = pDVar7;
      pQVar11[lVar6].data.d.ptr = (args->data).d.ptr;
      pQVar11[lVar6].data.d.size = (args->data).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_004b9f75;
    }
    if (((i != 0) || (pDVar5 == (Data *)0x0)) ||
       ((QTtfGlyph *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr))
    goto LAB_004b9e9e;
    pQVar10 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
    pQVar10[-1].numPoints = args->numPoints;
    qVar14 = args->xMin;
    qVar15 = args->xMax;
    qVar16 = args->yMin;
    qVar17 = args->yMax;
    qVar3 = args->advanceWidth;
    qVar18 = args->lsb;
    qVar19 = args->numContours;
    pQVar10[-1].index = args->index;
    pQVar10[-1].xMin = qVar14;
    pQVar10[-1].xMax = qVar15;
    pQVar10[-1].yMin = qVar16;
    pQVar10[-1].yMax = qVar17;
    pQVar10[-1].advanceWidth = qVar3;
    pQVar10[-1].lsb = qVar18;
    pQVar10[-1].numContours = qVar19;
    pDVar7 = (args->data).d.d;
    pQVar10[-1].data.d.d = pDVar7;
    pQVar10[-1].data.d.ptr = (args->data).d.ptr;
    pQVar10[-1].data.d.size = (args->data).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_004b9f75:
  pqVar2 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }